

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_dehexify.c
# Opt level: O2

void * x11_dehexify(ptrlen hexpl,int *outlen)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  char bytestr [3];
  uint val;
  ulong local_40;
  int *local_38;
  
  uVar2 = hexpl.len >> 1;
  local_38 = outlen;
  pvVar1 = safemalloc((long)(int)uVar2,1,0);
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = uVar2 & 0xffffffff;
  }
  local_40 = uVar2;
  for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    val = 0;
    bytestr[0] = *(char *)((long)hexpl.ptr + uVar3 * 2);
    bytestr[1] = *(char *)((long)hexpl.ptr + uVar3 * 2 + 1);
    bytestr[2] = '\0';
    __isoc99_sscanf(bytestr,"%x",&val);
    *(undefined1 *)((long)pvVar1 + uVar3) = (undefined1)val;
  }
  *local_38 = (int)local_40;
  return pvVar1;
}

Assistant:

void *x11_dehexify(ptrlen hexpl, int *outlen)
{
    int len, i;
    unsigned char *ret;

    len = hexpl.len / 2;
    ret = snewn(len, unsigned char);

    for (i = 0; i < len; i++) {
        char bytestr[3];
        unsigned val = 0;
        bytestr[0] = ((const char *)hexpl.ptr)[2*i];
        bytestr[1] = ((const char *)hexpl.ptr)[2*i+1];
        bytestr[2] = '\0';
        sscanf(bytestr, "%x", &val);
        ret[i] = val;
    }

    *outlen = len;
    return ret;
}